

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropymode.c
# Opt level: O1

void av1_init_mode_probs(FRAME_CONTEXT *fc)

{
  aom_cdf_prob (*paaVar1) [5];
  segmentation_probs *psVar2;
  aom_cdf_prob (*paaVar3) [3];
  aom_cdf_prob (*paaVar4) [9];
  long lVar5;
  aom_cdf_prob *paVar6;
  aom_cdf_prob (*paaaVar7) [3] [3];
  aom_cdf_prob (*paaaVar8) [6] [3];
  aom_cdf_prob (*paaVar9) [8];
  aom_cdf_prob (*paaaVar10) [3] [3];
  aom_cdf_prob (*paaaVar11) [6] [3];
  byte bVar12;
  
  bVar12 = 0;
  lVar5 = 0x1c;
  paVar6 = default_palette_y_size_cdf[0];
  paaVar9 = fc->palette_y_size_cdf;
  for (; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(undefined4 *)*paaVar9 = *(undefined4 *)paVar6;
    paVar6 = paVar6 + 2;
    paaVar9 = (aom_cdf_prob (*) [8])(*paaVar9 + 2);
  }
  lVar5 = 0x1c;
  paVar6 = default_palette_uv_size_cdf[0];
  paaVar9 = fc->palette_uv_size_cdf;
  for (; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(undefined4 *)*paaVar9 = *(undefined4 *)paVar6;
    paVar6 = paVar6 + 2;
    paaVar9 = (aom_cdf_prob (*) [8])(*paaVar9 + 2);
  }
  memcpy(fc->palette_y_color_index_cdf,default_palette_y_color_index_cdf,0x276);
  memcpy(fc->palette_uv_color_index_cdf,default_palette_uv_color_index_cdf,0x276);
  memcpy(fc->kf_y_cdf,default_kf_y_mode_cdf,700);
  memcpy(fc->angle_delta_cdf,default_angle_delta_cdf,0x80);
  *(aom_cdf_prob *)((long)(fc->comp_inter_cdf + 0) + 0) = 0x1734;
  *(aom_cdf_prob *)((long)(fc->comp_inter_cdf + 0) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->comp_inter_cdf + 0) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->comp_inter_cdf + 1) + 0) = 0x221d;
  *(undefined8 *)(fc->comp_inter_cdf[1] + 1) = 0x510100000000;
  *(undefined8 *)(fc->comp_inter_cdf[2] + 1) = 0x567000000000;
  *(undefined8 *)(fc->comp_inter_cdf[3] + 2) = 0x74ab0000;
  *(aom_cdf_prob *)((long)(fc->comp_ref_type_cdf + 0) + 0) = 0x7b52;
  *(aom_cdf_prob *)((long)(fc->comp_ref_type_cdf + 0) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->comp_ref_type_cdf + 0) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->comp_ref_type_cdf + 1) + 0) = 0x77ea;
  *(undefined8 *)(fc->comp_ref_type_cdf[1] + 1) = 0x5c3200000000;
  *(undefined8 *)(fc->comp_ref_type_cdf[2] + 1) = 0x62b500000000;
  *(undefined8 *)(fc->comp_ref_type_cdf[3] + 2) = 0x28350000;
  *(aom_cdf_prob *)((long)(fc->uni_comp_ref_cdf[0] + 0) + 0) = 0x6b5c;
  *(aom_cdf_prob *)((long)(fc->uni_comp_ref_cdf[0] + 0) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->uni_comp_ref_cdf[0] + 0) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->uni_comp_ref_cdf[0] + 1) + 0) = 0x70e7;
  *(undefined8 *)(fc->uni_comp_ref_cdf[0][1] + 1) = 0x73c800000000;
  *(undefined8 *)(fc->uni_comp_ref_cdf[0][2] + 2) = 0x25900000;
  paaaVar7 = fc->uni_comp_ref_cdf;
  *(aom_cdf_prob *)((long)(paaaVar7[1] + 1) + 0) = 0x48a3;
  *(aom_cdf_prob *)((long)(paaaVar7[1] + 1) + 2) = 0;
  *(aom_cdf_prob *)((long)(paaaVar7[1] + 1) + 4) = 0;
  *(aom_cdf_prob *)((long)(paaaVar7[1] + 2) + 0) = 0x445a;
  *(undefined8 *)(fc->uni_comp_ref_cdf[1][2] + 1) = 0x3e200000000;
  *(undefined8 *)(fc->uni_comp_ref_cdf[2][0] + 2) = 0x1de00000;
  *(undefined8 *)(fc->uni_comp_ref_cdf[2][1] + 2) = 0x17aa0000;
  paaaVar7 = default_palette_y_mode_cdf;
  paaaVar10 = fc->palette_y_mode_cdf;
  for (lVar5 = 0x1f; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(undefined4 *)(*paaaVar10)[0] = *(undefined4 *)(*paaaVar7)[0];
    paaaVar7 = (aom_cdf_prob (*) [3] [3])((long)paaaVar7 + ((ulong)bVar12 * -2 + 1) * 4);
    paaaVar10 = (aom_cdf_prob (*) [3] [3])((long)paaaVar10 + (ulong)bVar12 * -8 + 4);
  }
  fc->palette_y_mode_cdf[6][2][2] = 0;
  *(aom_cdf_prob *)((long)(fc->palette_uv_mode_cdf + 0) + 0) = 0x133;
  *(aom_cdf_prob *)((long)(fc->palette_uv_mode_cdf + 0) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->palette_uv_mode_cdf + 0) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->palette_uv_mode_cdf + 1) + 0) = 0x2c10;
  *(aom_cdf_prob *)((long)(fc->palette_uv_mode_cdf + 1) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->palette_uv_mode_cdf + 1) + 4) = 0;
  *(undefined8 *)(fc->comp_ref_cdf[1][2] + 1) = 0x7f500000000;
  *(undefined8 *)(fc->comp_ref_cdf[2][0] + 2) = 0x6ad0000;
  *(undefined8 *)(fc->comp_ref_cdf[0][2] + 2) = 0x324d0000;
  paaaVar7 = fc->comp_ref_cdf;
  *(aom_cdf_prob *)((long)(paaaVar7[1] + 1) + 0) = 0x2857;
  *(aom_cdf_prob *)((long)(paaaVar7[1] + 1) + 2) = 0;
  *(aom_cdf_prob *)((long)(paaaVar7[1] + 1) + 4) = 0;
  *(aom_cdf_prob *)((long)(paaaVar7[1] + 2) + 0) = 0x44c8;
  *(aom_cdf_prob *)((long)(fc->comp_ref_cdf[0] + 0) + 0) = 0x6cae;
  *(aom_cdf_prob *)((long)(fc->comp_ref_cdf[0] + 0) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->comp_ref_cdf[0] + 0) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->comp_ref_cdf[0] + 1) + 0) = 0x5b04;
  *(undefined8 *)(fc->comp_ref_cdf[0][1] + 1) = 0x7a2100000000;
  *(undefined8 *)(fc->comp_ref_cdf[2][1] + 2) = 0x14680000;
  paaVar3 = fc->comp_bwdref_cdf[2];
  *(aom_cdf_prob *)((long)(paaVar3 + 1) + 2) = 0;
  *(aom_cdf_prob *)((long)(paaVar3 + 1) + 4) = 0;
  *(undefined8 *)(fc->comp_bwdref_cdf[1][0] + 2) = 0x44b90000;
  *(aom_cdf_prob *)((long)(fc->comp_bwdref_cdf[2] + 0) + 0) = 0x872;
  *(aom_cdf_prob *)((long)(fc->comp_bwdref_cdf[2] + 0) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->comp_bwdref_cdf[2] + 0) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->comp_bwdref_cdf[2] + 1) + 0) = 0x8e7;
  *(aom_cdf_prob *)((long)(fc->comp_bwdref_cdf[0] + 0) + 0) = 0x7745;
  *(aom_cdf_prob *)((long)(fc->comp_bwdref_cdf[0] + 0) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->comp_bwdref_cdf[0] + 0) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->comp_bwdref_cdf[0] + 1) + 0) = 0x7a71;
  *(undefined8 *)(fc->comp_bwdref_cdf[0][1] + 1) = 0x3ce200000000;
  paaaVar8 = default_single_ref_cdf;
  paaaVar11 = fc->single_ref_cdf;
  for (lVar5 = 0x1b; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(undefined4 *)(*paaaVar11)[0] = *(undefined4 *)(*paaaVar8)[0];
    paaaVar8 = (aom_cdf_prob (*) [6] [3])((long)paaaVar8 + ((ulong)bVar12 * -2 + 1) * 4);
    paaaVar11 = (aom_cdf_prob (*) [6] [3])((long)paaaVar11 + (ulong)bVar12 * -8 + 4);
  }
  memcpy(fc->txfm_partition_cdf,default_txfm_partition_cdf,0x7e);
  *(aom_cdf_prob *)((long)(fc->compound_index_cdf + 5) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->compound_index_cdf + 5) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->compound_index_cdf + 0) + 0) = 0x38bc;
  *(aom_cdf_prob *)((long)(fc->compound_index_cdf + 0) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->compound_index_cdf + 0) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->compound_index_cdf + 1) + 0) = 0x4dbf;
  *(undefined8 *)(fc->compound_index_cdf[1] + 1) = 0x647300000000;
  *(undefined8 *)(fc->compound_index_cdf[2] + 2) = 0x4c350000;
  *(aom_cdf_prob *)((long)(fc->compound_index_cdf + 4) + 0) = 0x5b8a;
  *(aom_cdf_prob *)((long)(fc->compound_index_cdf + 4) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->compound_index_cdf + 4) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->compound_index_cdf + 5) + 0) = 0x6ddc;
  *(aom_cdf_prob *)((long)(fc->comp_group_idx_cdf + 5) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->comp_group_idx_cdf + 5) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->comp_group_idx_cdf + 0) + 0) = 0x1811;
  *(aom_cdf_prob *)((long)(fc->comp_group_idx_cdf + 0) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->comp_group_idx_cdf + 0) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->comp_group_idx_cdf + 1) + 0) = 0x2695;
  *(undefined8 *)(fc->comp_group_idx_cdf[1] + 1) = 0x366800000000;
  *(undefined8 *)(fc->comp_group_idx_cdf[2] + 2) = 0x1fee0000;
  *(aom_cdf_prob *)((long)(fc->comp_group_idx_cdf + 4) + 0) = 0x3222;
  *(aom_cdf_prob *)((long)(fc->comp_group_idx_cdf + 4) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->comp_group_idx_cdf + 4) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->comp_group_idx_cdf + 5) + 0) = 0x276e;
  *(aom_cdf_prob *)((long)(fc->newmv_cdf + 5) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->newmv_cdf + 5) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->newmv_cdf + 0) + 0) = 0x221d;
  *(aom_cdf_prob *)((long)(fc->newmv_cdf + 0) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->newmv_cdf + 0) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->newmv_cdf + 1) + 0) = 0x3f0a;
  *(undefined8 *)(fc->newmv_cdf[1] + 1) = 0x441500000000;
  *(undefined8 *)(fc->newmv_cdf[2] + 2) = 0x5f3e0000;
  *(aom_cdf_prob *)((long)(fc->newmv_cdf + 4) + 0) = 0x5042;
  *(aom_cdf_prob *)((long)(fc->newmv_cdf + 4) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->newmv_cdf + 4) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->newmv_cdf + 5) + 0) = 0x6dbc;
  *(aom_cdf_prob *)((long)(fc->zeromv_cdf + 0) + 0) = 0x7781;
  *(aom_cdf_prob *)((long)(fc->zeromv_cdf + 0) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->zeromv_cdf + 0) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->zeromv_cdf + 1) + 0) = 0x7be2;
  *(aom_cdf_prob *)((long)(fc->zeromv_cdf + 1) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->zeromv_cdf + 1) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->refmv_cdf + 5) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->refmv_cdf + 5) + 4) = 0;
  *(undefined8 *)(fc->refmv_cdf[2] + 2) = 0x10320000;
  *(aom_cdf_prob *)((long)(fc->refmv_cdf + 4) + 0) = 0x2108;
  *(aom_cdf_prob *)((long)(fc->refmv_cdf + 4) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->refmv_cdf + 4) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->refmv_cdf + 5) + 0) = 0x322d;
  *(aom_cdf_prob *)((long)(fc->refmv_cdf + 0) + 0) = 0x225a;
  *(aom_cdf_prob *)((long)(fc->refmv_cdf + 0) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->refmv_cdf + 0) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->refmv_cdf + 1) + 0) = 0x2184;
  *(undefined8 *)(fc->refmv_cdf[1] + 1) = 0x3a4800000000;
  fc->drl_cdf[2][2] = 0;
  *(aom_cdf_prob *)((long)(fc->drl_cdf + 0) + 0) = 0x4cd0;
  *(aom_cdf_prob *)((long)(fc->drl_cdf + 0) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->drl_cdf + 0) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->drl_cdf + 1) + 0) = 0x2010;
  *(undefined8 *)(fc->drl_cdf[1] + 1) = 0x35ff00000000;
  memcpy(fc->motion_mode_cdf,default_motion_mode_cdf,0xb0);
  memcpy(fc->obmc_cdf,default_obmc_cdf,0x84);
  memcpy(fc->inter_compound_mode_cdf,default_inter_compound_mode_cdf,0x90);
  memcpy(fc->compound_type_cdf,default_compound_type_cdf,0x84);
  memcpy(fc->wedge_idx_cdf,default_wedge_idx_cdf,0x2ec);
  *(aom_cdf_prob *)((long)(fc->interintra_cdf + 0) + 0) = 0x4000;
  *(aom_cdf_prob *)((long)(fc->interintra_cdf + 0) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->interintra_cdf + 0) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->interintra_cdf + 1) + 0) = 0x16f9;
  *(undefined8 *)(fc->interintra_cdf[1] + 1) = 0x143300000000;
  *(undefined8 *)(fc->interintra_cdf[2] + 2) = 0x9e30000;
  memcpy(fc->wedge_interintra_cdf,default_wedge_interintra_cdf,0x84);
  *(aom_cdf_prob *)((long)(fc->interintra_mode_cdf + 0) + 0) = 0x6000;
  *(aom_cdf_prob *)((long)(fc->interintra_mode_cdf + 0) + 2) = 0x4000;
  *(aom_cdf_prob *)((long)(fc->interintra_mode_cdf + 0) + 4) = 0x2000;
  *(aom_cdf_prob *)((long)(fc->interintra_mode_cdf + 0) + 6) = 0;
  *(undefined8 *)(fc->interintra_mode_cdf[0] + 4) = 0x153c54b678ad0000;
  *(undefined8 *)(fc->interintra_mode_cdf[1] + 3) = 0x58f4765700000000;
  *(undefined8 *)(fc->interintra_mode_cdf[2] + 2) = 0x6f720000000018ec;
  paaVar1 = fc->interintra_mode_cdf;
  *(aom_cdf_prob *)((long)(paaVar1 + 3) + 2) = 0x52ef;
  *(aom_cdf_prob *)((long)(paaVar1 + 3) + 4) = 0x1aba;
  *(aom_cdf_prob *)((long)(paaVar1 + 3) + 6) = 0;
  *(aom_cdf_prob *)((long)(paaVar1 + 3) + 8) = 0;
  (fc->seg).pred_cdf[2][2] = 0;
  *(aom_cdf_prob *)((long)((fc->seg).pred_cdf + 0) + 0) = 0x4000;
  *(aom_cdf_prob *)((long)((fc->seg).pred_cdf + 0) + 2) = 0;
  *(aom_cdf_prob *)((long)((fc->seg).pred_cdf + 0) + 4) = 0;
  *(aom_cdf_prob *)((long)((fc->seg).pred_cdf + 1) + 0) = 0x4000;
  *(undefined8 *)((fc->seg).pred_cdf[1] + 1) = 0x400000000000;
  memcpy(fc->filter_intra_cdfs,default_filter_intra_cdfs,0x84);
  fc->filter_intra_mode_cdf[0] = 0x5d0b;
  fc->filter_intra_mode_cdf[1] = 0x4e18;
  fc->filter_intra_mode_cdf[2] = 0x3cc5;
  fc->filter_intra_mode_cdf[3] = 0xc8a;
  fc->filter_intra_mode_cdf[4] = 0;
  fc->filter_intra_mode_cdf[5] = 0;
  fc->switchable_restore_cdf[0] = 0x5b3b;
  fc->switchable_restore_cdf[1] = 0x27cb;
  fc->switchable_restore_cdf[2] = 0;
  fc->switchable_restore_cdf[3] = 0;
  fc->wiener_restore_cdf[2] = 0;
  fc->wiener_restore_cdf[0] = 0x52ce;
  fc->wiener_restore_cdf[1] = 0;
  fc->sgrproj_restore_cdf[2] = 0;
  fc->sgrproj_restore_cdf[0] = 0x3e29;
  fc->sgrproj_restore_cdf[1] = 0;
  memcpy(fc->y_mode_cdf,default_if_y_mode_cdf,0x70);
  memcpy(fc->uv_mode_cdf,default_uv_mode_cdf,0x30c);
  memcpy(fc->switchable_interp_cdf,default_switchable_interp_cdf,0x80);
  memcpy(fc->partition_cdf,default_partition_cdf,0x1b8);
  memcpy(fc->intra_ext_tx_cdf,default_intra_ext_tx_cdf,0x14b8);
  memcpy(fc->inter_ext_tx_cdf,default_inter_ext_tx_cdf,0x220);
  fc->skip_mode_cdfs[2][2] = 0;
  *(aom_cdf_prob *)((long)(fc->skip_mode_cdfs + 0) + 0) = 0x93;
  *(aom_cdf_prob *)((long)(fc->skip_mode_cdfs + 0) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->skip_mode_cdfs + 0) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->skip_mode_cdfs + 1) + 0) = 0x2f1c;
  *(undefined8 *)(fc->skip_mode_cdfs[1] + 1) = 0x604100000000;
  fc->skip_txfm_cdfs[2][2] = 0;
  *(aom_cdf_prob *)((long)(fc->skip_txfm_cdfs + 0) + 0) = 0x449;
  *(aom_cdf_prob *)((long)(fc->skip_txfm_cdfs + 0) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->skip_txfm_cdfs + 0) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->skip_txfm_cdfs + 1) + 0) = 0x3f7d;
  *(undefined8 *)(fc->skip_txfm_cdfs[1] + 1) = 0x6e2000000000;
  *(aom_cdf_prob *)((long)(fc->intra_inter_cdf + 0) + 0) = 0x7cda;
  *(aom_cdf_prob *)((long)(fc->intra_inter_cdf + 0) + 2) = 0;
  *(aom_cdf_prob *)((long)(fc->intra_inter_cdf + 0) + 4) = 0;
  *(aom_cdf_prob *)((long)(fc->intra_inter_cdf + 1) + 0) = 0x3eea;
  *(undefined8 *)(fc->intra_inter_cdf[1] + 1) = 0x312600000000;
  *(undefined8 *)(fc->intra_inter_cdf[2] + 2) = 0x18560000;
  *(aom_cdf_prob *)((long)((fc->seg).spatial_pred_seg_cdf + 0) + 0) = 0x6a0a;
  *(aom_cdf_prob *)((long)((fc->seg).spatial_pred_seg_cdf + 0) + 2) = 0x612b;
  *(aom_cdf_prob *)((long)((fc->seg).spatial_pred_seg_cdf + 0) + 4) = 0x4123;
  *(aom_cdf_prob *)((long)((fc->seg).spatial_pred_seg_cdf + 0) + 6) = 0x38c7;
  psVar2 = &fc->seg;
  *(aom_cdf_prob *)((long)(psVar2->spatial_pred_seg_cdf + 0) + 8) = 0x135f;
  *(aom_cdf_prob *)((long)(psVar2->spatial_pred_seg_cdf + 0) + 10) = 0x112b;
  *(aom_cdf_prob *)((long)(psVar2->spatial_pred_seg_cdf + 0) + 0xc) = 0xeb;
  *(aom_cdf_prob *)((long)(psVar2->spatial_pred_seg_cdf + 0) + 0xe) = 0;
  *(undefined8 *)((fc->seg).spatial_pred_seg_cdf[0] + 8) = 0x27e338ca483e0000;
  paaVar4 = (fc->seg).spatial_pred_seg_cdf;
  *(aom_cdf_prob *)((long)(paaVar4 + 1) + 6) = 0x1e99;
  *(aom_cdf_prob *)((long)(paaVar4 + 1) + 8) = 0xae4;
  *(aom_cdf_prob *)((long)(paaVar4 + 1) + 10) = 0x77d;
  *(aom_cdf_prob *)((long)(paaVar4 + 1) + 0xc) = 0x1a8;
  *(undefined8 *)((fc->seg).spatial_pred_seg_cdf[1] + 7) = 0x10b9147900000000;
  paaVar4 = (fc->seg).spatial_pred_seg_cdf;
  *(aom_cdf_prob *)((long)(paaVar4 + 2) + 4) = 0xfcd;
  *(aom_cdf_prob *)((long)(paaVar4 + 2) + 6) = 0xf26;
  *(aom_cdf_prob *)((long)(paaVar4 + 2) + 8) = 0x173;
  *(aom_cdf_prob *)((long)(paaVar4 + 2) + 10) = 0x79;
  paaVar4 = (fc->seg).spatial_pred_seg_cdf;
  *(aom_cdf_prob *)((long)(paaVar4 + 2) + 10) = 0x79;
  *(aom_cdf_prob *)((long)(paaVar4 + 2) + 0xc) = 0x59;
  *(aom_cdf_prob *)((long)(paaVar4 + 2) + 0xe) = 0;
  *(aom_cdf_prob *)((long)(paaVar4 + 2) + 0x10) = 0;
  memcpy(fc->tx_size_cdf,default_tx_size_cdf,0x60);
  fc->delta_q_cdf[0] = 0x1200;
  fc->delta_q_cdf[1] = 0x288;
  fc->delta_q_cdf[2] = 0x5b;
  fc->delta_q_cdf[3] = 0;
  fc->delta_q_cdf[4] = 0;
  fc->delta_lf_cdf[0] = 0x1200;
  fc->delta_lf_cdf[1] = 0x288;
  fc->delta_lf_cdf[2] = 0x5b;
  fc->delta_lf_cdf[3] = 0;
  fc->delta_lf_cdf[4] = 0;
  *(aom_cdf_prob *)((long)(fc->delta_lf_multi_cdf + 0) + 0) = 0x1200;
  *(aom_cdf_prob *)((long)(fc->delta_lf_multi_cdf + 0) + 2) = 0x288;
  *(aom_cdf_prob *)((long)(fc->delta_lf_multi_cdf + 0) + 4) = 0x5b;
  *(aom_cdf_prob *)((long)(fc->delta_lf_multi_cdf + 0) + 6) = 0;
  *(undefined8 *)(fc->delta_lf_multi_cdf[0] + 4) = 0x5b028812000000;
  *(undefined8 *)(fc->delta_lf_multi_cdf[1] + 3) = 0x288120000000000;
  *(undefined8 *)(fc->delta_lf_multi_cdf[2] + 2) = 0x120000000000005b;
  paaVar1 = fc->delta_lf_multi_cdf;
  *(aom_cdf_prob *)((long)(paaVar1 + 3) + 2) = 0x288;
  *(aom_cdf_prob *)((long)(paaVar1 + 3) + 4) = 0x5b;
  *(aom_cdf_prob *)((long)(paaVar1 + 3) + 6) = 0;
  *(aom_cdf_prob *)((long)(paaVar1 + 3) + 8) = 0;
  fc->cfl_sign_cdf[8] = 0;
  fc->cfl_sign_cdf[0] = 0x7a76;
  fc->cfl_sign_cdf[1] = 0x77b5;
  fc->cfl_sign_cdf[2] = 0x4be4;
  fc->cfl_sign_cdf[3] = 0x381b;
  fc->cfl_sign_cdf[4] = 0x16a4;
  fc->cfl_sign_cdf[5] = 0x1149;
  fc->cfl_sign_cdf[6] = 0x1da;
  fc->cfl_sign_cdf[7] = 0;
  memcpy(fc->cfl_alpha_cdf,default_cfl_alpha_cdf,0xcc);
  fc->intrabc_cdf[2] = 0;
  fc->intrabc_cdf[0] = 0x8bd;
  fc->intrabc_cdf[1] = 0;
  return;
}

Assistant:

void av1_init_mode_probs(FRAME_CONTEXT *fc) {
  av1_copy(fc->palette_y_size_cdf, default_palette_y_size_cdf);
  av1_copy(fc->palette_uv_size_cdf, default_palette_uv_size_cdf);
  av1_copy(fc->palette_y_color_index_cdf, default_palette_y_color_index_cdf);
  av1_copy(fc->palette_uv_color_index_cdf, default_palette_uv_color_index_cdf);
  av1_copy(fc->kf_y_cdf, default_kf_y_mode_cdf);
  av1_copy(fc->angle_delta_cdf, default_angle_delta_cdf);
  av1_copy(fc->comp_inter_cdf, default_comp_inter_cdf);
  av1_copy(fc->comp_ref_type_cdf, default_comp_ref_type_cdf);
  av1_copy(fc->uni_comp_ref_cdf, default_uni_comp_ref_cdf);
  av1_copy(fc->palette_y_mode_cdf, default_palette_y_mode_cdf);
  av1_copy(fc->palette_uv_mode_cdf, default_palette_uv_mode_cdf);
  av1_copy(fc->comp_ref_cdf, default_comp_ref_cdf);
  av1_copy(fc->comp_bwdref_cdf, default_comp_bwdref_cdf);
  av1_copy(fc->single_ref_cdf, default_single_ref_cdf);
  av1_copy(fc->txfm_partition_cdf, default_txfm_partition_cdf);
  av1_copy(fc->compound_index_cdf, default_compound_idx_cdfs);
  av1_copy(fc->comp_group_idx_cdf, default_comp_group_idx_cdfs);
  av1_copy(fc->newmv_cdf, default_newmv_cdf);
  av1_copy(fc->zeromv_cdf, default_zeromv_cdf);
  av1_copy(fc->refmv_cdf, default_refmv_cdf);
  av1_copy(fc->drl_cdf, default_drl_cdf);
  av1_copy(fc->motion_mode_cdf, default_motion_mode_cdf);
  av1_copy(fc->obmc_cdf, default_obmc_cdf);
  av1_copy(fc->inter_compound_mode_cdf, default_inter_compound_mode_cdf);
  av1_copy(fc->compound_type_cdf, default_compound_type_cdf);
  av1_copy(fc->wedge_idx_cdf, default_wedge_idx_cdf);
  av1_copy(fc->interintra_cdf, default_interintra_cdf);
  av1_copy(fc->wedge_interintra_cdf, default_wedge_interintra_cdf);
  av1_copy(fc->interintra_mode_cdf, default_interintra_mode_cdf);
  av1_copy(fc->seg.pred_cdf, default_segment_pred_cdf);
  av1_copy(fc->filter_intra_cdfs, default_filter_intra_cdfs);
  av1_copy(fc->filter_intra_mode_cdf, default_filter_intra_mode_cdf);
  av1_copy(fc->switchable_restore_cdf, default_switchable_restore_cdf);
  av1_copy(fc->wiener_restore_cdf, default_wiener_restore_cdf);
  av1_copy(fc->sgrproj_restore_cdf, default_sgrproj_restore_cdf);
  av1_copy(fc->y_mode_cdf, default_if_y_mode_cdf);
  av1_copy(fc->uv_mode_cdf, default_uv_mode_cdf);
  av1_copy(fc->switchable_interp_cdf, default_switchable_interp_cdf);
  av1_copy(fc->partition_cdf, default_partition_cdf);
  av1_copy(fc->intra_ext_tx_cdf, default_intra_ext_tx_cdf);
  av1_copy(fc->inter_ext_tx_cdf, default_inter_ext_tx_cdf);
  av1_copy(fc->skip_mode_cdfs, default_skip_mode_cdfs);
  av1_copy(fc->skip_txfm_cdfs, default_skip_txfm_cdfs);
  av1_copy(fc->intra_inter_cdf, default_intra_inter_cdf);
  for (int i = 0; i < SPATIAL_PREDICTION_PROBS; i++)
    av1_copy(fc->seg.spatial_pred_seg_cdf[i],
             default_spatial_pred_seg_tree_cdf[i]);
  av1_copy(fc->tx_size_cdf, default_tx_size_cdf);
  av1_copy(fc->delta_q_cdf, default_delta_q_cdf);
  av1_copy(fc->delta_lf_cdf, default_delta_lf_cdf);
  av1_copy(fc->delta_lf_multi_cdf, default_delta_lf_multi_cdf);
  av1_copy(fc->cfl_sign_cdf, default_cfl_sign_cdf);
  av1_copy(fc->cfl_alpha_cdf, default_cfl_alpha_cdf);
  av1_copy(fc->intrabc_cdf, default_intrabc_cdf);
}